

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O0

Voice * __thiscall Synthesizer::SynthesizerChannel::AllocateVoice(SynthesizerChannel *this,int key)

{
  int iVar1;
  SynthesizerChannel *this_00;
  float fVar2;
  float fVar3;
  int local_3c;
  int n;
  Voice *q;
  SynthesizerChannel *pSStack_28;
  int i;
  Voice *v;
  int key_local;
  SynthesizerChannel *this_local;
  
  this_local = (SynthesizerChannel *)this->keys[key];
  if (this_local == (SynthesizerChannel *)0x0) {
    if (this->numvoices < 0x20) {
      iVar1 = this->numvoices;
      this->numvoices = iVar1 + 1;
      pSStack_28 = (SynthesizerChannel *)this->voicepool[iVar1];
    }
    else {
      pSStack_28 = (SynthesizerChannel *)this->voicepool[0];
      for (q._4_4_ = 1; q._4_4_ < this->numvoices; q._4_4_ = q._4_4_ + 1) {
        this_00 = (SynthesizerChannel *)this->voicepool[q._4_4_];
        fVar2 = Voice::GetImportance((Voice *)this_00);
        fVar3 = Voice::GetImportance((Voice *)pSStack_28);
        if (fVar2 < fVar3) {
          pSStack_28 = this_00;
        }
      }
      for (local_3c = 0; local_3c < 0x80; local_3c = local_3c + 1) {
        if ((SynthesizerChannel *)this->keys[local_3c] == pSStack_28) {
          this->keys[local_3c] = (Voice *)0x0;
        }
      }
    }
    this->keys[key] = (Voice *)pSStack_28;
    this_local = pSStack_28;
  }
  return (Voice *)this_local;
}

Assistant:

Voice* AllocateVoice(int key)
        {
            Voice* v = keys[key];
            if (v != NULL)
                return v;

            if (numvoices < MAXVOICES)
                v = voicepool[numvoices++];
            else
            {
                v = voicepool[0];
                for (int i = 1; i < numvoices; i++)
                {
                    Voice* q = voicepool[i];
                    if (q->GetImportance() < v->GetImportance())
                        v = q;
                }
                for (int n = 0; n < 128; n++)
                    if (keys[n] == v)
                        keys[n] = NULL;
            }

            keys[key] = v;
            return v;
        }